

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O3

void rest_engravings(memfile *mf,level *lev)

{
  char cVar1;
  engr *peVar2;
  int8_t iVar3;
  uint len;
  engr *peVar4;
  char *pcVar5;
  engr *peVar6;
  
  mfmagic_check(mf,0x52474e45);
  lev->lev_engr = (engr *)0x0;
  len = mread32(mf);
  while( true ) {
    if (len == 0) {
      if (lev->lev_engr == (engr *)0x0) {
        peVar4 = (engr *)0x0;
      }
      else {
        peVar2 = lev->lev_engr;
        peVar6 = (engr *)0x0;
        do {
          peVar4 = peVar2;
          peVar2 = peVar4->nxt_engr;
          peVar4->nxt_engr = peVar6;
          peVar6 = peVar4;
        } while (peVar2 != (engr *)0x0);
      }
      lev->lev_engr = peVar4;
      return;
    }
    if (0x100 < len) break;
    peVar4 = (engr *)malloc((ulong)len + 0x28);
    peVar4->engr_lth = len;
    iVar3 = mread8(mf);
    peVar4->engr_x = iVar3;
    iVar3 = mread8(mf);
    peVar4->engr_y = iVar3;
    iVar3 = mread8(mf);
    peVar4->engr_type = iVar3;
    peVar4->engr_txt = (char *)(peVar4 + 1);
    mread(mf,peVar4 + 1,len);
    peVar4->nxt_engr = lev->lev_engr;
    lev->lev_engr = peVar4;
    pcVar5 = peVar4->engr_txt;
    cVar1 = *pcVar5;
    while (cVar1 == ' ') {
      pcVar5 = pcVar5 + 1;
      peVar4->engr_txt = pcVar5;
      cVar1 = *pcVar5;
    }
    peVar4->engr_time = (ulong)moves;
    len = mread32(mf);
  }
  panic("rest_engravings: engraving length too long! (%d)",(ulong)len);
}

Assistant:

void rest_engravings(struct memfile *mf, struct level *lev)
{
	struct engr *ep, *eprev, *enext;
	unsigned lth;

	mfmagic_check(mf, ENGRAVE_MAGIC);
	lev->lev_engr = NULL;
	while (1) {
		lth = mread32(mf);
		if (!lth) /* no more engravings */
		    break;
		if (lth > BUFSZ)
		    panic("rest_engravings: engraving length too long! (%d)", lth);

		ep = newengr(lth);
		ep->engr_lth = lth;
		ep->engr_x = mread8(mf);
		ep->engr_y = mread8(mf);
		ep->engr_type = mread8(mf);
		ep->engr_txt = (char *)(ep + 1);
		mread(mf, ep->engr_txt, lth);

		ep->nxt_engr = lev->lev_engr;
		lev->lev_engr = ep;
		while (ep->engr_txt[0] == ' ')
		    ep->engr_txt++;
		/* mark as finished for bones levels -- no problem for
		 * normal levels as the player must have finished engraving
		 * to be able to move again */
		ep->engr_time = moves;
	}

	/* engravings loaded above are reversed, so put it back in the right order */
	ep = lev->lev_engr;
	eprev = NULL;
	while (ep) {
		enext = ep->nxt_engr;
		ep->nxt_engr = eprev;
		eprev = ep;
		ep = enext;
	}
	lev->lev_engr = eprev;
}